

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

void __thiscall Problem_CGBG_FF::ScatterHouses(Problem_CGBG_FF *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if (this->_m_nrHouses != 0) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      iVar1 = rand();
      (this->_m_housePositionX).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (double)iVar1 / 2147483647.0;
      iVar1 = rand();
      (this->_m_housePositionY).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (double)iVar1 / 2147483647.0;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < this->_m_nrHouses);
  }
  return;
}

Assistant:

void Problem_CGBG_FF::ScatterHouses()
{
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        //we sample a position for this house
        _m_housePositionX[hI] = SampleUniform();
        _m_housePositionY[hI] = SampleUniform();
    }
}